

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_db_class.cpp
# Opt level: O2

void __thiscall test_cpp_db::test_is_null::test_method(test_is_null *this)

{
  readonly_property<bool> rVar1;
  shared_count *psVar2;
  any *this_00;
  unit_test_log_t *puVar3;
  value *pvVar4;
  parameter *ppVar5;
  assertion_result local_498;
  assertion_result local_480;
  char **local_468;
  null_type null;
  value local_458;
  value local_448;
  parameter pnull;
  const_string local_3d0;
  const_string local_3c0;
  const_string local_3b0;
  const_string local_3a0;
  const_string local_390 [4];
  const_string local_350;
  const_string local_340;
  const_string local_330;
  const_string local_320;
  const_string local_310 [4];
  const_string local_2d0;
  const_string local_2c0;
  const_string local_2b0;
  const_string local_2a0;
  const_string local_290 [4];
  const_string local_250;
  const_string local_240;
  const_string local_230;
  const_string local_220;
  const_string local_210 [4];
  const_string local_1d0;
  const_string local_1c0;
  const_string local_1b0;
  const_string local_1a0;
  const_string local_190 [4];
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  null.tag_type = (type_info *)&void::typeinfo;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x24,&local_50);
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "cpp_db::is_null(null)";
  local_498.m_message.px = (element_type *)0x15daec;
  pnull.argument._M_storage._0_1_ = 0;
  pnull.argument._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&PTR__lazy_ostream_0018e658;
  pnull._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_60.m_end = "";
  pnull.name._M_dataplus._M_p = (pointer)&local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)&pnull,&local_60,0x24,CHECK,CHECK_PRED,0);
  psVar2 = &local_480.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_70,0x25,&local_80);
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "!cpp_db::is_null(1)";
  local_498.m_message.px = (element_type *)0x15db00;
  pnull.argument._M_storage._0_1_ = 0;
  pnull.argument._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&PTR__lazy_ostream_0018e658;
  pnull._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_90.m_end = "";
  pnull.name._M_dataplus._M_p = (pointer)&local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)&pnull,&local_90,0x25,CHECK,CHECK_PRED,0);
  psVar2 = &local_480.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_458._M_manager = std::any::_Manager_internal<cpp_db::null_type>::_S_manage;
  local_458._M_storage = (_Storage)null.tag_type;
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_a0,0x28,&local_b0);
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)cpp_db::is_null(&local_458);
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_498._0_8_ = "cpp_db::is_null(vnull)";
  local_498.m_message.px = (element_type *)0x15db17;
  pnull.argument._M_storage._0_1_ = 0;
  pnull.argument._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&PTR__lazy_ostream_0018e658;
  pnull._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_c0.m_end = "";
  pnull.name._M_dataplus._M_p = (pointer)&local_498;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)&pnull,&local_c0,0x28,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_448._M_manager = std::any::_Manager_internal<cpp_db::null_type>::_S_manage;
  local_448._M_storage = (_Storage)null.tag_type;
  cpp_db::parameter::parameter(&pnull,0,&local_448);
  this_00 = &local_448;
  std::any::reset(this_00);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_d0,0x2b,&local_e0);
  rVar1.super_class_property<bool>.value = (class_property<bool>)cpp_db::is_null(&pnull.argument);
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_468 = &local_f0;
  local_f0 = "cpp_db::is_null(pnull)";
  local_e8 = "";
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e658;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_100.m_end = "";
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_100,0x2b,CHECK,CHECK_PRED,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_110.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_110.m_end = "";
  local_120.m_begin = "";
  local_120.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_110,0x2d,&local_120);
  puVar3 = (unit_test_log_t *)&null;
  cpp_db::type_of<cpp_db::null_type>((null_type *)puVar3);
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_130,0x2d,&local_140);
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_150.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_150.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_150,0x2d,CHECK,CHECK_MSG,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_190[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_190[0].m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,local_190,0x2e,&local_1a0);
  pvVar4 = &local_458;
  cpp_db::type_of(pvVar4);
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1b0.m_end = "";
  local_1c0.m_begin = "";
  local_1c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pvVar4,&local_1b0,0x2e,&local_1c0);
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_1d0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_1d0,0x2e,CHECK,CHECK_MSG,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_210[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_210[0].m_end = "";
  local_220.m_begin = "";
  local_220.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,local_210,0x2f,&local_220);
  ppVar5 = &pnull;
  cpp_db::type_of(&ppVar5->argument);
  local_230.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_230.m_end = "";
  local_240.m_begin = "";
  local_240.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)ppVar5,&local_230,0x2f,&local_240);
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_250.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_250,0x2f,CHECK,CHECK_MSG,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_290[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_290[0].m_end = "";
  local_2a0.m_begin = "";
  local_2a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,local_290,0x31,&local_2a0);
  puVar3 = (unit_test_log_t *)&null;
  cpp_db::value_of<cpp_db::null_type>((null_type *)puVar3);
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,&local_2b0,0x31,&local_2c0);
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_2d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_2d0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_2d0,0x31,CHECK,CHECK_MSG,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_310[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_310[0].m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,local_310,0x32,&local_320);
  pvVar4 = &local_458;
  cpp_db::numeric_extractor<int>(pvVar4);
  local_330.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_330.m_end = "";
  local_340.m_begin = "";
  local_340.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pvVar4,&local_330,0x32,&local_340);
  local_498.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_350.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_350,0x32,CHECK,CHECK_MSG,0);
  psVar2 = &local_498.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_390[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_390[0].m_end = "";
  local_3a0.m_begin = "";
  local_3a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,local_390,0x33,&local_3a0);
  ppVar5 = &pnull;
  cpp_db::numeric_extractor<int>(&ppVar5->argument);
  local_3b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_3b0.m_end = "";
  local_3c0.m_begin = "";
  local_3c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)ppVar5,&local_3b0,0x33,&local_3c0);
  local_498._0_8_ = (ulong)(uint7)local_498._1_7_ << 8;
  local_498.m_message.px = (element_type *)0x0;
  local_498.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_480.m_message.px = (element_type *)((ulong)local_480.m_message.px & 0xffffffffffffff00);
  local_480._0_8_ = &PTR__lazy_ostream_0018e698;
  local_480.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_468 = (char **)0x15db2f;
  local_3d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_3d0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_498,(lazy_ostream *)&local_480,&local_3d0,0x33,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_498.m_message.pn);
  cpp_db::parameter::~parameter(&pnull);
  std::any::reset(&local_458);
  return;
}

Assistant:

ostream& operator << (ostream& os, type_index ti)
    {
        os << "{" << ti.name() << ", " << ti.hash_code() << "}";
        return os;
    }